

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirewirePort.cpp
# Opt level: O2

nodeid_t __thiscall FirewirePort::InitNodes(FirewirePort *this)

{
  ushort uVar1;
  short sVar2;
  uint uVar3;
  ostream *poVar4;
  
  uVar1 = raw1394_get_local_id(this->handle);
  this->baseNodeId = uVar1 & 0xffc0;
  poVar4 = std::operator<<((this->super_BasePort).outStr,"FirewirePort::InitNodes: base node id = ")
  ;
  *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
       *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->baseNodeId);
  *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
       *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::endl<char,std::char_traits<char>>(poVar4);
  uVar3 = raw1394_get_generation(this->handle);
  (this->super_BasePort).FwBusGeneration = uVar3;
  (this->super_BasePort).newFwBusGeneration = uVar3;
  sVar2 = raw1394_get_nodecount(this->handle);
  return sVar2 - 1;
}

Assistant:

nodeid_t FirewirePort::InitNodes(void)
{
    // Get base node id (zero out 6 lsb)
    baseNodeId = raw1394_get_local_id(handle) & 0xFFC0;
    outStr << "FirewirePort::InitNodes: base node id = " << std::hex << baseNodeId << std::dec << std::endl;

    // Get Firewire bus generation
    FwBusGeneration = raw1394_get_generation(handle);
    newFwBusGeneration = FwBusGeneration;

    // Get total number of nodes on bus
    int numNodes = raw1394_get_nodecount(handle);
    // Subtract 1 for PC which, as bus master, is always the highest number
    return (numNodes-1);
}